

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

yyjson_mut_val * duckdb::ToJSONRecursive(yyjson_mut_doc *doc,ProfilingNode *node)

{
  yyjson_mut_val *pyVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  yyjson_val_pool *pyVar5;
  long *plVar6;
  ulong uVar7;
  size_t sVar8;
  ProfilingNode *in_RSI;
  long in_RDI;
  bool bVar9;
  yyjson_mut_val *child;
  idx_t i;
  yyjson_mut_val *children_list;
  ProfilingInfo *profiling_info;
  yyjson_mut_val *result_obj;
  yyjson_mut_val *val;
  yyjson_mut_val *val_2;
  bool noesc;
  size_t key_len;
  yyjson_mut_val *val_5;
  size_t len_1;
  yyjson_mut_val *key;
  yyjson_val_pool *pool_2;
  yyjson_alc *alc_2;
  yyjson_mut_val *val_4;
  yyjson_val_pool *pool_1;
  yyjson_alc *alc_1;
  yyjson_mut_val *val_3;
  ProfilingInfo *in_stack_000001c0;
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_mut_val *val_1;
  yyjson_mut_val *next;
  yyjson_mut_val *prev;
  size_t len;
  uint8_t tag;
  uint64_t tag_1;
  yyjson_mut_val *next_key;
  yyjson_mut_val *prev_val;
  uint64_t tag_3;
  uint8_t tag_2;
  ProfilingNode *in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd22;
  undefined1 in_stack_fffffffffffffd23;
  undefined1 in_stack_fffffffffffffd24;
  undefined1 in_stack_fffffffffffffd25;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  optional_ptr<duckdb::ProfilingNode,_true> in_stack_fffffffffffffd38;
  yyjson_alc *in_stack_fffffffffffffd40;
  yyjson_val_pool *in_stack_fffffffffffffd48;
  yyjson_val_pool *pyVar10;
  yyjson_val_pool *pool_00;
  ProfilingNode *pPVar11;
  ProfilingNode *local_228;
  ulong *local_210;
  ulong *local_148;
  ulong *local_118;
  ProfilingNode *local_e8;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  
  if (in_RDI == 0) {
LAB_0089fc6c:
    local_228 = (ProfilingNode *)0x0;
  }
  else {
    plVar6 = (long *)(in_RDI + 0x50);
    if (((*(long *)(in_RDI + 0x58) - *plVar6) / 0x18 == 0) &&
       (bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow
                          (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                           (usize)in_stack_fffffffffffffd38.ptr), ((bVar4 ^ 0xffU) & 1) != 0)) {
      local_e8 = (ProfilingNode *)0x0;
    }
    else {
      local_e8 = (ProfilingNode *)*plVar6;
      *plVar6 = *plVar6 + 0x18;
    }
    if (local_e8 == (ProfilingNode *)0x0) goto LAB_0089fc6c;
    local_e8->_vptr_ProfilingNode = (_func_int **)0x7;
    local_228 = local_e8;
  }
  ProfilingNode::GetProfilingInfo(in_RSI);
  QueryProfiler::JSONSanitize(in_stack_ffffffffffffff78);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT17(in_stack_fffffffffffffd27,
                          CONCAT16(in_stack_fffffffffffffd26,
                                   CONCAT15(in_stack_fffffffffffffd25,
                                            CONCAT14(in_stack_fffffffffffffd24,
                                                     CONCAT13(in_stack_fffffffffffffd23,
                                                              CONCAT12(in_stack_fffffffffffffd22,
                                                                       in_stack_fffffffffffffd20))))
                                  )),
              (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffd18);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~InsertionOrderPreservingMap
            ((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffd27,
                         CONCAT16(in_stack_fffffffffffffd26,
                                  CONCAT15(in_stack_fffffffffffffd25,
                                           CONCAT14(in_stack_fffffffffffffd24,
                                                    CONCAT13(in_stack_fffffffffffffd23,
                                                             CONCAT12(in_stack_fffffffffffffd22,
                                                                      in_stack_fffffffffffffd20)))))
                        ));
  ProfilingInfo::WriteMetricsToJSON
            (in_stack_000001c0,(yyjson_mut_doc *)val_3,(yyjson_mut_val *)alc_1);
  if (in_RDI != 0) {
    plVar6 = (long *)(in_RDI + 0x50);
    if (((*(long *)(in_RDI + 0x58) - *plVar6) / 0x18 == 0) &&
       (bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow
                          (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                           (usize)in_stack_fffffffffffffd38.ptr), ((bVar4 ^ 0xffU) & 1) != 0)) {
      local_118 = (ulong *)0x0;
    }
    else {
      local_118 = (ulong *)*plVar6;
      *plVar6 = *plVar6 + 0x18;
    }
    if (local_118 != (ulong *)0x0) {
      *local_118 = 6;
      local_210 = local_118;
      goto LAB_0089fe57;
    }
  }
  local_210 = (ulong *)0x0;
LAB_0089fe57:
  pyVar10 = (yyjson_val_pool *)0x0;
  while (pool_00 = pyVar10,
        pyVar5 = (yyjson_val_pool *)ProfilingNode::GetChildCount((ProfilingNode *)0x89fe84),
        pyVar10 < pyVar5) {
    in_stack_fffffffffffffd38 = ProfilingNode::GetChild(in_stack_fffffffffffffd18,0x89feb4);
    optional_ptr<duckdb::ProfilingNode,_true>::operator*
              ((optional_ptr<duckdb::ProfilingNode,_true> *)
               CONCAT17(in_stack_fffffffffffffd27,
                        CONCAT16(in_stack_fffffffffffffd26,
                                 CONCAT15(in_stack_fffffffffffffd25,
                                          CONCAT14(in_stack_fffffffffffffd24,
                                                   CONCAT13(in_stack_fffffffffffffd23,
                                                            CONCAT12(in_stack_fffffffffffffd22,
                                                                     in_stack_fffffffffffffd20))))))
              );
    in_stack_fffffffffffffd40 = (yyjson_alc *)ToJSONRecursive((yyjson_mut_doc *)in_RSI,local_228);
    if (local_210 == (ulong *)0x0) {
      in_stack_fffffffffffffd27 = false;
    }
    else {
      in_stack_fffffffffffffd27 = ((byte)*local_210 & 7) == 6;
    }
    in_stack_fffffffffffffd26 =
         (bool)in_stack_fffffffffffffd27 != false && in_stack_fffffffffffffd40 != (yyjson_alc *)0x0;
    if ((bool)in_stack_fffffffffffffd26) {
      uVar7 = *local_210;
      *local_210 = ((uVar7 >> 8) + 1) * 0x100 | *local_210 & 0xff;
      if (uVar7 >> 8 == 0) {
        in_stack_fffffffffffffd40->free = (_func_void_void_ptr_void_ptr *)in_stack_fffffffffffffd40;
      }
      else {
        pyVar1 = *(yyjson_mut_val **)(local_210[1] + 0x10);
        *(yyjson_alc **)(local_210[1] + 0x10) = in_stack_fffffffffffffd40;
        in_stack_fffffffffffffd40->free = (_func_void_void_ptr_void_ptr *)pyVar1;
      }
      local_210[1] = (ulong)in_stack_fffffffffffffd40;
    }
    pyVar10 = (yyjson_val_pool *)((long)&pool_00->cur + 1);
  }
  pPVar11 = local_228;
  if (local_210 != (ulong *)0x0) {
    bVar4 = false;
    if (in_RDI != 0) {
      if (local_228 == (ProfilingNode *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = ((byte)local_228->_vptr_ProfilingNode & 7) == 7;
      }
      bVar4 = false;
      if (bVar9) {
        bVar4 = true;
      }
    }
    if (bVar4) {
      plVar6 = (long *)(in_RDI + 0x50);
      if (((ulong)((*(long *)(in_RDI + 0x58) - *plVar6) / 0x18) < 2) &&
         (bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow
                            (pool_00,in_stack_fffffffffffffd40,(usize)in_stack_fffffffffffffd38.ptr)
         , ((bVar4 ^ 0xffU) & 1) != 0)) {
        local_148 = (ulong *)0x0;
      }
      else {
        local_148 = (ulong *)*plVar6;
        *plVar6 = *plVar6 + 0x30;
      }
      if (local_148 != (ulong *)0x0) {
        uVar7 = (ulong)local_228->_vptr_ProfilingNode >> 8;
        strlen("children");
        *local_148 = 5;
        *local_148 = *local_148;
        sVar8 = strlen("children");
        *local_148 = sVar8 << 8 | *local_148;
        local_148[1] = (ulong)"children";
        if (uVar7 == 0) {
          local_210[2] = (ulong)local_148;
        }
        else {
          lVar2 = *(long *)(((yyjson_val_uni *)&local_228->profiling_info)->u64 + 0x10);
          uVar3 = *(ulong *)(lVar2 + 0x10);
          *(ulong **)(lVar2 + 0x10) = local_148;
          local_210[2] = uVar3;
        }
        local_148[2] = (ulong)local_210;
        ((yyjson_val_uni *)&local_228->profiling_info)->str = (char *)local_148;
        local_228->_vptr_ProfilingNode =
             (_func_int **)((uVar7 + 1) * 0x100 | (ulong)local_228->_vptr_ProfilingNode & 0xff);
      }
    }
  }
  return (yyjson_mut_val *)pPVar11;
}

Assistant:

static yyjson_mut_val *ToJSONRecursive(yyjson_mut_doc *doc, ProfilingNode &node) {
	auto result_obj = yyjson_mut_obj(doc);
	auto &profiling_info = node.GetProfilingInfo();
	profiling_info.extra_info = QueryProfiler::JSONSanitize(profiling_info.extra_info);
	profiling_info.WriteMetricsToJSON(doc, result_obj);

	auto children_list = yyjson_mut_arr(doc);
	for (idx_t i = 0; i < node.GetChildCount(); i++) {
		auto child = ToJSONRecursive(doc, *node.GetChild(i));
		yyjson_mut_arr_add_val(children_list, child);
	}
	yyjson_mut_obj_add_val(doc, result_obj, "children", children_list);
	return result_obj;
}